

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnm_io.cc
# Opt level: O2

void __thiscall
gimage::PNMImageIO::load
          (PNMImageIO *this,ImageU8 *image,char *name,int ds,long x,long y,long w,long h)

{
  size_t sVar1;
  uchar uVar2;
  byte bVar3;
  int iVar4;
  IOException *pIVar5;
  size_t __n;
  ulong uVar6;
  long lVar7;
  int ii;
  int d;
  ulong uVar8;
  long lVar9;
  long lVar10;
  size_t __n_00;
  long i;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  pos_type pVar14;
  int local_344;
  ulong local_340;
  ulong local_338;
  ulong local_330;
  long local_328;
  ulong local_320;
  long local_318;
  long local_310;
  long local_308;
  ulong local_300;
  long local_2f8;
  valarray<int> nline;
  valarray<int> vline;
  int depth;
  __mbstate_t local_2a8;
  long height;
  long width;
  long local_290;
  ImageU8 *local_288;
  long local_280;
  long local_278;
  ulong local_270;
  long local_268;
  ulong local_260;
  ulong local_258;
  ulong local_250;
  long maxval;
  float scale;
  ifstream in;
  
  local_318 = x;
  local_310 = y;
  iVar4 = (*(this->super_BasicImageIO)._vptr_BasicImageIO[3])(this,name,1);
  if ((char)iVar4 == '\0') {
    pIVar5 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&nline,name,(allocator *)&local_344);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vline,
                   "Can only load PNM image (",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nline);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&in,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vline,")");
    gutil::IOException::IOException(pIVar5,(string *)&in);
    __cxa_throw(pIVar5,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  pVar14 = anon_unknown_11::readPNMHeader(name,&depth,&maxval,&scale,&width,&height);
  local_2a8 = pVar14._M_state;
  if ((scale == 0.0) && (!NAN(scale))) {
    if (0xff < maxval) {
      pIVar5 = (IOException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string((string *)&nline,name,(allocator *)&local_344);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vline,
                     "A 16 bit image cannot be loaded as 8 bit image (",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nline);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&in,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vline,")"
                    );
      gutil::IOException::IOException(pIVar5,(string *)&in);
      __cxa_throw(pIVar5,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
    }
    local_338 = 1;
    if (1 < ds) {
      local_338 = (ulong)(uint)ds;
    }
    local_340 = w;
    if (w < 0) {
      local_340 = (long)(width + local_338 + -1) / (long)local_338;
    }
    if (h < 0) {
      h = (long)(height + local_338 + -1) / (long)local_338;
    }
    local_320 = (ulong)depth;
    local_330 = h;
    Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize(image,local_340,h,local_320);
    sVar1 = image->n;
    __n = -sVar1;
    if (0 < (long)sVar1) {
      __n = sVar1;
    }
    memset(image->pixel,0,__n);
    std::ifstream::ifstream(&in);
    std::ios::exceptions((int)&in + (int)*(undefined8 *)(_in + -0x18));
    std::ifstream::open((char *)&in,(_Ios_Openmode)name);
    local_328 = width;
    local_2f8 = height;
    if ((((ds < 2) && (local_310 == 0 && local_318 == 0)) && (local_340 == width)) &&
       (local_330 == height)) {
      std::istream::seekg(&in,pVar14._M_off,local_2a8);
      uVar6 = 0;
      uVar12 = local_320 & 0xffffffff;
      if ((int)local_320 < 1) {
        uVar12 = uVar6;
      }
      if ((long)local_340 < 1) {
        local_340 = uVar6;
      }
      if ((long)local_330 < 1) {
        local_330 = uVar6;
      }
      for (; uVar6 != local_330; uVar6 = uVar6 + 1) {
        for (uVar11 = 0; uVar11 != local_340; uVar11 = uVar11 + 1) {
          for (uVar8 = 0; uVar12 != uVar8; uVar8 = uVar8 + 1) {
            uVar2 = std::streambuf::sbumpc();
            image->img[uVar8][uVar6][uVar11] = uVar2;
          }
        }
      }
    }
    else {
      nline._M_size._0_4_ = 0;
      __n_00 = local_340 * local_320;
      std::valarray<int>::valarray(&vline,(int *)&nline,__n_00);
      local_344 = 0;
      std::valarray<int>::valarray(&nline,&local_344,__n_00);
      local_250 = 0;
      uVar12 = -local_310;
      if (-local_310 == 0 || 0 < local_310) {
        uVar12 = local_250;
      }
      local_278 = local_328 * local_320;
      lVar10 = 0;
      if (0 < local_318) {
        lVar10 = local_318;
      }
      local_300 = -local_318;
      if (-local_318 == 0 || 0 < local_318) {
        local_300 = local_250;
      }
      local_308 = local_300 * local_320;
      if (0 < (int)local_320) {
        local_250 = local_320 & 0xffffffff;
      }
      lVar9 = local_250 * 8;
      local_280 = lVar10 * local_338 * local_320 + pVar14._M_off;
      local_290 = lVar9;
      local_288 = image;
      while (((long)uVar12 < (long)local_330 &&
             (local_268 = (uVar12 + local_310) * local_338, local_268 < local_2f8))) {
        local_344 = 0;
        std::valarray<int>::operator=(&vline,&local_344);
        local_344 = 0;
        std::valarray<int>::operator=(&nline,&local_344);
        uVar6 = 0;
        local_270 = uVar12;
        while ((lVar10 = local_308, uVar12 = local_300, uVar6 != local_338 &&
               ((long)(uVar6 + local_268) < local_2f8))) {
          local_260 = uVar6;
          std::istream::seekg(&in,(uVar6 + local_268) * local_278 + local_280,local_2a8);
          uVar12 = local_300;
          lVar10 = local_308;
          while (((long)uVar12 < (long)local_340 &&
                 (lVar9 = (uVar12 + local_318) * local_338, lVar9 < local_328))) {
            local_258 = uVar12;
            for (uVar6 = 0;
                (uVar6 < local_338 &&
                (lVar7 = lVar10, uVar12 = local_250, (long)(lVar9 + uVar6) < local_328));
                uVar6 = uVar6 + 1) {
              while (bVar13 = uVar12 != 0, uVar12 = uVar12 - 1, bVar13) {
                bVar3 = std::streambuf::sbumpc();
                vline._M_data[lVar7] = vline._M_data[lVar7] + (uint)bVar3;
                nline._M_data[lVar7] = nline._M_data[lVar7] + 1;
                lVar7 = lVar7 + 1;
              }
            }
            lVar10 = lVar10 + local_320;
            uVar12 = local_258 + 1;
          }
          image = local_288;
          lVar9 = local_290;
          uVar6 = local_260 + 1;
        }
        for (; ((long)uVar12 < (long)local_340 &&
               ((long)((local_318 + uVar12) * local_338) < local_328)); uVar12 = uVar12 + 1) {
          for (lVar7 = 0; lVar9 != lVar7; lVar7 = lVar7 + 8) {
            if (0 < nline._M_data[lVar10]) {
              *(char *)(*(long *)(*(long *)((long)image->img + lVar7) + local_270 * 8) + uVar12) =
                   (char)(vline._M_data[lVar10] / nline._M_data[lVar10]);
            }
            lVar10 = lVar10 + 1;
          }
        }
        uVar12 = local_270 + 1;
      }
      operator_delete(nline._M_data);
      operator_delete(vline._M_data);
    }
    std::ifstream::close();
    std::ifstream::~ifstream(&in);
    return;
  }
  pIVar5 = (IOException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&nline,name,(allocator *)&local_344);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vline,
                 "A float image cannot be loaded as 8 bit image (",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nline);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&in,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vline,")");
  gutil::IOException::IOException(pIVar5,(string *)&in);
  __cxa_throw(pIVar5,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
}

Assistant:

void PNMImageIO::load(ImageU8 &image, const char *name, int ds, long x, long y,
                      long w, long h) const
{
  long  width, height, maxval;
  float scale;
  int   depth;
  std::istream::pos_type pos;

  if (!handlesFile(name, true))
  {
    throw gutil::IOException("Can only load PNM image ("+std::string(name)+")");
  }

  pos=readPNMHeader(name, depth, maxval, scale, width, height);

  if (scale != 0)
  {
    throw gutil::IOException("A float image cannot be loaded as 8 bit image ("+std::string(name)+")");
  }

  if (maxval > 255)
  {
    throw gutil::IOException("A 16 bit image cannot be loaded as 8 bit image ("+std::string(name)+")");
  }

  ds=std::max(1, ds);

  if (w < 0)
  {
    w=(width+ds-1)/ds;
  }

  if (h < 0)
  {
    h=(height+ds-1)/ds;
  }

  image.setSize(w, h, depth);
  image.clear();

  try
  {
    std::ifstream in;
    in.exceptions(std::ios_base::failbit | std::ios_base::badbit | std::ios_base::eofbit);
    in.open(name, std::ios::binary);

    // load downscaled part?

    if (ds > 1 || x != 0 || y != 0 || w != width || h != height)
    {
      std::valarray<ImageU8::work_t> vline(0, w*depth);
      std::valarray<int> nline(0, w*depth);

      for (long k=std::max(0l, -y); k<h && (y+k)*ds<height; k++)
      {
        // load downscaled line

        vline=0;
        nline=0;

        for (long kk=0; kk<ds && kk+(y+k)*ds<height; kk++)
        {
          in.seekg(pos+static_cast<std::streamoff>((y+k)*ds+kk)*width*depth+
                   static_cast<std::streamoff>(std::max(0l, x))*ds*depth);

          std::streambuf *sb=in.rdbuf();

          long j=std::max(0l, -x)*depth;

          for (long i=std::max(0l, -x); i<w && (x+i)*ds<width; i++)
          {
            for (int ii=0; ii<ds && (x+i)*ds+ii<width; ii++)
            {
              for (int d=0; d<depth; d++)
              {
                ImageU8::store_t v=static_cast<ImageU8::store_t>(sb->sbumpc());

                if (image.isValidS(v))
                {
                  vline[j+d]+=v;
                  nline[j+d]++;
                }
              }
            }

            j+=depth;
          }
        }

        // store line into image

        long j=std::max(0l, -x)*depth;

        for (long i=std::max(0l, -x); i<w && (x+i)*ds<width; i++)
        {
          for (int d=0; d<depth; d++)
          {
            if (nline[j] > 0)
            {
              image.set(i, k, d, static_cast<ImageU8::store_t>(vline[j]/nline[j]));
            }

            j++;
          }
        }
      }
    }
    else // load whole image
    {
      in.seekg(pos);
      std::streambuf *sb=in.rdbuf();

      for (long k=0; k<height; k++)
      {
        for (long i=0; i<width; i++)
        {
          for (int d=0; d<depth; d++)
          {
            image.set(i, k, d, static_cast<ImageU8::store_t>(sb->sbumpc()));
          }
        }
      }
    }

    in.close();
  }
  catch (const std::ios_base::failure &ex)
  {
    throw gutil::IOException(ex.what());
  }
}